

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

void secp256k1_nonce_function_bip340_sha256_tagged(secp256k1_sha256 *sha)

{
  secp256k1_sha256_initialize(sha);
  sha->s[0] = 0x46615b35;
  sha->s[1] = 0xf4bfbff7;
  sha->s[2] = 0x9f8dc671;
  sha->s[3] = 0x83627ab3;
  sha->s[4] = 0x60217180;
  sha->s[5] = 0x57358661;
  sha->s[6] = 0x21a29e54;
  sha->s[7] = 0x68b07b4c;
  sha->bytes = 0x40;
  return;
}

Assistant:

static void secp256k1_nonce_function_bip340_sha256_tagged(secp256k1_sha256 *sha) {
    secp256k1_sha256_initialize(sha);
    sha->s[0] = 0x46615b35ul;
    sha->s[1] = 0xf4bfbff7ul;
    sha->s[2] = 0x9f8dc671ul;
    sha->s[3] = 0x83627ab3ul;
    sha->s[4] = 0x60217180ul;
    sha->s[5] = 0x57358661ul;
    sha->s[6] = 0x21a29e54ul;
    sha->s[7] = 0x68b07b4cul;

    sha->bytes = 64;
}